

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall
ninx::parser::Parser::Parser
          (Parser *this,
          vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
          *tokens,string *origin)

{
  pointer pcVar1;
  
  (this->origin)._M_dataplus._M_p = (pointer)&(this->origin).field_2;
  pcVar1 = (origin->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + origin->_M_string_length)
  ;
  TokenReader::TokenReader(&this->reader,tokens);
  (this->operators)._M_h._M_buckets = &(this->operators)._M_h._M_single_bucket;
  (this->operators)._M_h._M_bucket_count = 1;
  (this->operators)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->operators)._M_h._M_element_count = 0;
  (this->operators)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->operators)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->operators)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

ninx::parser::Parser::Parser(std::vector<std::unique_ptr<Token>> &tokens, const std::string &origin) : origin(origin),
                                                                                                       reader(tokens) {

}